

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ifDec75.c
# Opt level: O2

int Dau_DsdCheckDecAndExist_rec(char *pStr,char **p,int *pMatches,int *pnSupp)

{
  byte bVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  byte *pbVar6;
  uint uVar7;
  long lVar8;
  uint uVar9;
  long lVar10;
  int iVar11;
  int *pnSupp_00;
  int uSupp;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  
  pbVar6 = (byte *)*p;
  if (*pbVar6 != 0x21) goto LAB_0032ba77;
  do {
    pbVar6 = pbVar6 + 1;
    *p = (char *)pbVar6;
LAB_0032ba77:
    bVar1 = *pbVar6;
  } while ((byte)(bVar1 - 0x30) < 10 || (byte)(bVar1 + 0xbf) < 6);
  if ((byte)(bVar1 + 0x9f) < 0x1a) {
    *pnSupp = *pnSupp + 1;
    uVar7 = 0;
  }
  else if ((bVar1 - 0x3c < 0x40) &&
          ((0x8000000080000001U >> ((ulong)(bVar1 - 0x3c) & 0x3f) & 1) != 0)) {
    iVar11 = pMatches[(long)pbVar6 - (long)pStr];
    if (bVar1 + 2 != (int)pStr[iVar11]) {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0xac,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
    uVar7 = 0;
    while( true ) {
      pbVar6 = pbVar6 + 1;
      *p = (char *)pbVar6;
      if (pStr + iVar11 <= pbVar6) break;
      _uSupp = _uSupp & 0xffffffff00000000;
      uVar4 = Dau_DsdCheckDecAndExist_rec(pStr,p,pMatches,&uSupp);
      uVar7 = uVar7 | uVar4;
      *pnSupp = *pnSupp + uSupp;
      pbVar6 = (byte *)*p;
    }
    if (pbVar6 != (byte *)(pStr + iVar11)) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0xb3,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
  }
  else {
    if (bVar1 != 0x28) {
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0xb6,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
    local_48 = 0;
    uStack_40 = 0;
    _uSupp = 0;
    uStack_50 = 0;
    iVar11 = pMatches[(long)pbVar6 - (long)pStr];
    if (pStr[iVar11] != ')') {
      __assert_fail("*q == **p + 1 + (**p != \'(\')",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0x8b,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
    lVar8 = 0;
    pnSupp_00 = &uSupp;
    uVar4 = 0;
    uVar7 = 0;
    while( true ) {
      pbVar6 = pbVar6 + 1;
      *p = (char *)pbVar6;
      if (pStr + iVar11 <= pbVar6) break;
      uVar5 = Dau_DsdCheckDecAndExist_rec(pStr,p,pMatches,pnSupp_00);
      uVar7 = uVar7 | uVar5;
      iVar2 = *pnSupp_00;
      *pnSupp = *pnSupp + iVar2;
      uVar4 = uVar4 + (iVar2 == 1);
      pbVar6 = (byte *)*p;
      lVar8 = lVar8 + -1;
      pnSupp_00 = pnSupp_00 + 1;
    }
    if (pbVar6 != (byte *)(pStr + iVar11)) {
      __assert_fail("*p == q",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0x92,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
    if (-lVar8 == 0 || lVar8 == -1) {
      __assert_fail("nParts > 1",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                    ,0x93,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
    }
    if (uVar4 != 0) {
      for (uVar5 = 1; (int)uVar5 < 1 << ((byte)-lVar8 & 0x1f); uVar5 = uVar5 + 1) {
        uVar9 = 0;
        for (lVar10 = 0; -lVar10 != lVar8; lVar10 = lVar10 + 1) {
          iVar11 = (&uSupp)[lVar10];
          if (1 < iVar11) {
            if ((uVar5 >> ((uint)lVar10 & 0x1f) & 1) == 0) {
              iVar11 = 0;
            }
            uVar9 = uVar9 + iVar11;
          }
        }
        if (8 < (int)uVar9) {
          __assert_fail("Sum <= 8",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/map/if/ifDec75.c"
                        ,0x9d,"int Dau_DsdCheckDecAndExist_rec(char *, char **, int *, int *)");
        }
        uVar3 = uVar4;
        if (1 < (int)uVar9) {
          while (uVar3 != 0) {
            uVar7 = uVar7 | 1 << (uVar9 & 0x1f);
            uVar9 = uVar9 + 1;
            uVar3 = uVar3 - 1;
          }
        }
      }
      for (uVar5 = 2; uVar5 < uVar4; uVar5 = uVar5 + 1) {
        uVar7 = uVar7 | 1 << (uVar5 & 0x1f);
      }
    }
  }
  return uVar7;
}

Assistant:

int Dau_DsdCheckDecAndExist_rec( char * pStr, char ** p, int * pMatches, int * pnSupp )
{
    if ( **p == '!' )
        (*p)++;
    while ( (**p >= 'A' && **p <= 'F') || (**p >= '0' && **p <= '9') )
        (*p)++;
    if ( **p >= 'a' && **p <= 'z' ) // var
    {
        (*pnSupp)++;
        return 0;
    }
    if ( **p == '(' ) // and
    {
        unsigned Mask = 0;
        int m, i, pSupps[8] = {0}, nParts = 0, nSimple = 0, nMints;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            Mask |= Dau_DsdCheckDecAndExist_rec( pStr, p, pMatches, &pSupps[nParts] );
            nSimple += (pSupps[nParts] == 1);
            *pnSupp += pSupps[nParts++];
        }
        assert( *p == q );
        assert( nParts > 1 );
        if ( nSimple > 0 )
        {
            nMints = (1 << nParts);
            for ( m = 1; m < nMints; m++ )
            {
                int Sum = 0;
                for ( i = 0; i < nParts; i++ )
                    if ( pSupps[i] > 1 && ((m >> i) & 1) )
                        Sum += pSupps[i];
                assert( Sum <= 8 );
                if ( Sum >= 2 )
                    for ( i = 0; i < nSimple; i++ )
                        Mask |= (1 << (Sum + i));
            }
            for ( i = 2; i < nSimple; i++ )
                Mask |= (1 << i);
        }
        return Mask;
    }
    if ( **p == '<' || **p == '{' || **p == '[' ) // mux/xor/nondec
    {
        int uSupp;
        unsigned Mask = 0;
        char * q = pStr + pMatches[ *p - pStr ];
        assert( *q == **p + 1 + (**p != '(') );
        for ( (*p)++; *p < q; (*p)++ )
        {
            uSupp = 0;
            Mask |= Dau_DsdCheckDecAndExist_rec( pStr, p, pMatches, &uSupp );
            *pnSupp += uSupp;
        }
        assert( *p == q );
        return Mask;
    }
    assert( 0 );
    return 0;
}